

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalTypeOptimization.cpp
# Opt level: O2

Pass * wasm::createGlobalTypeOptimizationPass(void)

{
  Pass *__s;
  
  __s = (Pass *)operator_new(0xd8);
  memset(__s,0,0xd0);
  (__s->name)._M_dataplus._M_p = (pointer)&(__s->name).field_2;
  (__s->name).field_2._M_local_buf[0] = '\0';
  __s->_vptr_Pass = (_func_int **)&PTR__GlobalTypeOptimization_00e1e9d0;
  __s[1]._vptr_Pass = (_func_int **)(__s + 2);
  __s[1].runner = (PassRunner *)0x1;
  __s[1].name._M_dataplus._M_p = (pointer)0x0;
  __s[1].name._M_string_length = 0;
  *(undefined4 *)&__s[1].name.field_2 = 0x3f800000;
  *(undefined8 *)((long)&__s[1].name.field_2 + 8) = 0;
  __s[2]._vptr_Pass = (_func_int **)0x0;
  __s[2].runner = (PassRunner *)&__s[3].runner;
  __s[2].name._M_dataplus._M_p = (pointer)0x1;
  __s[2].name._M_string_length = 0;
  __s[2].name.field_2._M_allocated_capacity = 0;
  *(undefined4 *)((long)&__s[2].name.field_2 + 8) = 0x3f800000;
  __s[3]._vptr_Pass = (_func_int **)0x0;
  __s[3].runner = (PassRunner *)0x0;
  __s[3].name._M_dataplus._M_p = (pointer)&__s[4].name;
  __s[3].name._M_string_length = 1;
  __s[3].name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&__s[3].name.field_2 + 8) = 0;
  *(undefined4 *)&__s[4]._vptr_Pass = 0x3f800000;
  __s[4].runner = (PassRunner *)0x0;
  __s[4].name._M_dataplus._M_p = (pointer)0x0;
  return __s;
}

Assistant:

Pass* createGlobalTypeOptimizationPass() {
  return new GlobalTypeOptimization();
}